

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::objectivec::ExtensionMethodName_abi_cxx11_
          (string *__return_storage_ptr__,objectivec *this,FieldDescriptor *descriptor)

{
  string *__return_storage_ptr___00;
  allocator local_b1;
  string local_b0;
  allocator local_89;
  string local_88;
  undefined1 local_58 [8];
  string result;
  string name;
  FieldDescriptor *descriptor_local;
  
  __return_storage_ptr___00 = (string *)((long)&result.field_2 + 8);
  (anonymous_namespace)::NameFromFieldDescriptor_abi_cxx11_
            (__return_storage_ptr___00,(_anonymous_namespace_ *)this,descriptor);
  anon_unknown_0::UnderscoresToCamelCase((string *)local_58,__return_storage_ptr___00,false);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_88,"",&local_89);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"_Extension",&local_b1);
  anon_unknown_0::SanitizeNameForObjC
            (__return_storage_ptr__,&local_88,(string *)local_58,&local_b0,(string *)0x0);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator((allocator<char> *)&local_b1);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator((allocator<char> *)&local_89);
  std::__cxx11::string::~string((string *)local_58);
  std::__cxx11::string::~string((string *)(result.field_2._M_local_buf + 8));
  return __return_storage_ptr__;
}

Assistant:

std::string ExtensionMethodName(const FieldDescriptor* descriptor) {
  const std::string name = NameFromFieldDescriptor(descriptor);
  const std::string result = UnderscoresToCamelCase(name, false);
  return SanitizeNameForObjC("", result, "_Extension", NULL);
}